

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O1

void __thiscall proto3_arena_unittest::TestUnpackedTypes::Clear(TestUnpackedTypes *this)

{
  anon_union_232_1_493b367e_for_TestUnpackedTypes_3 *this_00;
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this_01;
  RepeatedField<double> *this_02;
  RepeatedField<bool> *this_03;
  ulong uVar5;
  anon_union_232_1_493b367e_for_TestUnpackedTypes_3 aVar6;
  int iVar7;
  bool bVar8;
  
  this_00 = &this->field_0;
  aVar6 = this->field_0;
  if (((undefined1  [232])aVar6 & (undefined1  [232])0x4) != (undefined1  [232])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  bVar8 = ((undefined1  [232])aVar6 & (undefined1  [232])0x4) == (undefined1  [232])0x0;
  google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [232])((undefined1  [232])*this_00 & (undefined1  [232])0x4) !=
      (undefined1  [232])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  google::protobuf::RepeatedField<int>::set_size
            (&(this_00->_impl_).repeated_int32_,
             ((undefined1  [232])aVar6 & (undefined1  [232])0x4) == (undefined1  [232])0x0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_int64_;
  aVar6 = this->field_0;
  if (((undefined1  [232])aVar6 & (undefined1  [232])0x4) != (undefined1  [232])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar8 = ((undefined1  [232])aVar6 & (undefined1  [232])0x4) == (undefined1  [232])0x0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<long>::set_size
            (pRVar1,((undefined1  [232])aVar6 & (undefined1  [232])0x4) == (undefined1  [232])0x0,0)
  ;
  pRVar2 = &(this->field_0)._impl_.repeated_uint32_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size(pRVar2,(uVar5 & 4) == 0,0);
  pRVar3 = &(this->field_0)._impl_.repeated_uint64_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x30);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar3->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar3,(uVar5 & 4) == 0,0);
  pRVar4 = &(this->field_0)._impl_.repeated_sint32_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x40);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar4->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar4,(uVar5 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_sint64_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x50);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar1,(uVar5 & 4) == 0,0);
  pRVar2 = &(this->field_0)._impl_.repeated_fixed32_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x60);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar2->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar2->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar2);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size(pRVar2,(uVar5 & 4) == 0,0);
  pRVar3 = &(this->field_0)._impl_.repeated_fixed64_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x70);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar3->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar3->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar3);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar3,(uVar5 & 4) == 0,0);
  pRVar4 = &(this->field_0)._impl_.repeated_sfixed32_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x80);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar4->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar4,(uVar5 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_sfixed64_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0x90);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<long>::set_size(pRVar1,(uVar5 & 4) == 0,0);
  this_01 = &(this->field_0)._impl_.repeated_float_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0xa0);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  google::protobuf::RepeatedField<float>::set_size(this_01,(uVar5 & 4) == 0,0);
  this_02 = &(this->field_0)._impl_.repeated_double_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0xb0);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  google::protobuf::RepeatedField<double>::set_size(this_02,(uVar5 & 4) == 0,0);
  this_03 = &(this->field_0)._impl_.repeated_bool_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0xc0);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_03);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_03->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&this_03->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_03->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_03);
  }
  google::protobuf::RepeatedField<bool>::set_size(this_03,(uVar5 & 4) == 0,0);
  pRVar4 = &(this->field_0)._impl_.repeated_nested_enum_;
  uVar5 = *(ulong *)((long)&this->field_0 + 0xd0);
  if ((uVar5 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  bVar8 = (uVar5 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar8);
  iVar7 = google::protobuf::internal::SooRep::size(&pRVar4->soo_rep_,bVar8);
  if ((iVar7 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar4->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar4);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar4,(uVar5 & 4) == 0,0);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestUnpackedTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.TestUnpackedTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_int32_.Clear();
  _impl_.repeated_int64_.Clear();
  _impl_.repeated_uint32_.Clear();
  _impl_.repeated_uint64_.Clear();
  _impl_.repeated_sint32_.Clear();
  _impl_.repeated_sint64_.Clear();
  _impl_.repeated_fixed32_.Clear();
  _impl_.repeated_fixed64_.Clear();
  _impl_.repeated_sfixed32_.Clear();
  _impl_.repeated_sfixed64_.Clear();
  _impl_.repeated_float_.Clear();
  _impl_.repeated_double_.Clear();
  _impl_.repeated_bool_.Clear();
  _impl_.repeated_nested_enum_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}